

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O1

void __thiscall CVmFormatter::write_tab(CVmFormatter *this,int indent,int multiple)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  os_color_t oVar5;
  undefined4 uVar6;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  char buf [40];
  char acStack_48 [48];
  
  if ((this->field_0xef81 & 0x40) == 0) {
    if (multiple == 0) {
      if (indent != 0) {
        iVar7 = (*this->_vptr_CVmFormatter[0xe])(this);
        do {
          if (iVar7 <= this->linecol_) {
            return;
          }
          this->linebuf_[this->linepos_] = L' ';
          this->flagbuf_[this->linepos_] = this->cur_flags_;
          iVar3 = this->linepos_;
          uVar6 = *(undefined4 *)&(this->cur_color_).field_0x14;
          this->colorbuf_[iVar3].attr = (this->cur_color_).attr;
          *(undefined4 *)&this->colorbuf_[iVar3].field_0x14 = uVar6;
          oVar5 = (this->cur_color_).bg;
          this->colorbuf_[iVar3].fg = (this->cur_color_).fg;
          this->colorbuf_[iVar3].bg = oVar5;
          uVar1 = this->linepos_;
          uVar2 = this->linecol_;
          this->linepos_ = uVar1 + 1;
          this->linecol_ = uVar2 + 1;
          indent = indent + -1;
        } while (indent != 0);
      }
    }
    else {
      iVar7 = (*this->_vptr_CVmFormatter[0xe])(this);
      if (this->linecol_ < iVar7) {
        do {
          this->linebuf_[this->linepos_] = L' ';
          this->flagbuf_[this->linepos_] = this->cur_flags_;
          iVar3 = this->linepos_;
          uVar6 = *(undefined4 *)&(this->cur_color_).field_0x14;
          this->colorbuf_[iVar3].attr = (this->cur_color_).attr;
          *(undefined4 *)&this->colorbuf_[iVar3].field_0x14 = uVar6;
          oVar5 = (this->cur_color_).bg;
          this->colorbuf_[iVar3].fg = (this->cur_color_).fg;
          this->colorbuf_[iVar3].bg = oVar5;
          this->linepos_ = this->linepos_ + 1;
          iVar4 = this->linecol_;
          iVar3 = iVar4 + 1;
          this->linecol_ = iVar3;
          if ((iVar4 + 2) % multiple == 0) {
            return;
          }
        } while (iVar3 < iVar7);
      }
    }
  }
  else {
    pcVar8 = "INDENT";
    if (indent == 0) {
      pcVar8 = "MULTIPLE";
    }
    uVar9 = (ulong)(uint)multiple;
    if (indent != 0) {
      uVar9 = (ulong)(uint)indent;
    }
    sprintf(acStack_48,"<TAB %s=%d>",pcVar8,uVar9);
    buffer_string(this,acStack_48);
  }
  return;
}

Assistant:

void CVmFormatter::write_tab(VMG_ int indent, int multiple)
{
    int maxcol;

    /* check to see what the underlying system is expecting */
    if (html_target_)
    {
        char buf[40];

        /* 
         *   the underlying system is HTML - generate an appropriate <TAB>
         *   sequence to produce the desired effect 
         */
        sprintf(buf, "<TAB %s=%d>",
                indent != 0 ? "INDENT" : "MULTIPLE",
                indent != 0 ? indent : multiple);
            
        /* write it out */
        buffer_string(vmg_ buf);
    }
    else if (multiple != 0)
    {
        /* get the maximum column */
        maxcol = get_buffer_maxcol();

        /*
         *   We don't have an HTML target, and we have a tab to an every-N
         *   stop: expand the tab with spaces.  Keep going until we reach
         *   the next tab stop of the given multiple.  
         */
        do
        {
            /* stop if we've reached the maximum column */
            if (linecol_ >= maxcol)
                break;

            /* add another space */
            linebuf_[linepos_] = ' ';
            flagbuf_[linepos_] = cur_flags_;
            colorbuf_[linepos_] = cur_color_;

            /* advance one character in the buffer */
            ++linepos_;

            /* advance the column counter */
            ++linecol_;
        } while ((linecol_ + 1) % multiple != 0);
    }
    else if (indent != 0)
    {
        /* 
         *   We don't have an HTML target, and we just want to add a given
         *   number of spaces.  Simply write out the given number of spaces,
         *   up to our maximum column limit.  
         */
        for (maxcol = get_buffer_maxcol() ;
             indent != 0 && linecol_ < maxcol ; --indent)
        {
            /* add another space */
            linebuf_[linepos_] = ' ';
            flagbuf_[linepos_] = cur_flags_;
            colorbuf_[linepos_] = cur_color_;

            /* advance one character in the buffer and one column */
            ++linepos_;
            ++linecol_;
        }
    }
}